

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op<std::plus<float>>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar4;
  int i_11;
  int i_10;
  float b0_6;
  int x_3;
  float a0_5;
  int y_3;
  float *outptr_9;
  float *ptr1_5;
  int i_9;
  float *outptr_8;
  float *ptr1_4;
  float a0_4;
  int q_7;
  int i_8;
  float a0_3;
  int i_7;
  float a0_2;
  int i_6;
  float *outptr_7;
  float *ptr1_3;
  int q_6;
  float a0_1;
  int x_2;
  float b0_5;
  int y_2;
  float *outptr_6;
  float *ptr_6;
  int i_5;
  float b0_4;
  int i_4;
  int x_1;
  float a0;
  int y_1;
  float *outptr_5;
  float *ptr1_2;
  float *ptr_5;
  int q_5;
  int i_3;
  float *outptr_4;
  float b0_3;
  float *ptr_4;
  int q_4;
  int i_2;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  float b0_2;
  int x;
  float b0_1;
  int y;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  int i_1;
  float *outptr_1;
  float *ptr1;
  float *ptr_1;
  int q_1;
  int i;
  float *b0;
  float *outptr;
  float *ptr;
  int q;
  int size1;
  int channels1;
  int h1;
  int w1;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  plus<float> op;
  Mat *in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff85c;
  size_t in_stack_fffffffffffff860;
  int _c;
  Mat *pMVar5;
  int _h;
  undefined8 in_stack_fffffffffffff868;
  int _w;
  Mat *in_stack_fffffffffffff870;
  int local_660;
  int local_65c;
  float local_658;
  int local_654;
  float local_650;
  int local_64c;
  float *local_648;
  float *local_640;
  int local_634;
  Mat local_630;
  float *local_5f0;
  Mat local_5e8;
  float *local_5a8;
  float local_59c;
  int local_598;
  int local_594;
  float local_590;
  int local_58c;
  float local_588;
  int local_584;
  Mat local_580;
  float *local_540;
  Mat local_538;
  float *local_4f8;
  int local_4ec;
  float local_4e8;
  int local_4e4;
  float local_4e0;
  int local_4dc;
  float *local_4d8;
  float *local_4d0;
  int local_4c8;
  float local_4c4;
  int local_4c0;
  int local_4bc;
  float local_4b8;
  int local_4b4;
  Mat local_4b0;
  float *local_470;
  Mat local_468;
  float *local_428;
  float *local_420;
  int local_418;
  int local_414;
  Mat local_410;
  float *local_3d0;
  float local_3c4;
  Mat local_3c0;
  float *local_380;
  int local_378;
  int local_374;
  Mat local_370;
  float *local_330;
  Mat local_328;
  float *local_2e8;
  int local_2dc;
  float local_2d8;
  int local_2d4;
  float local_2d0;
  int local_2cc;
  Mat local_2c8;
  float *local_288;
  float *local_280;
  Mat local_278;
  float *local_238;
  int local_230;
  int local_22c;
  Mat local_228;
  float *local_1e8;
  Mat local_1e0;
  float *local_1a0;
  Mat local_198;
  float *local_158;
  int local_150;
  int local_14c;
  Mat local_148;
  float *local_108;
  Mat local_100;
  float *local_c0;
  Mat local_a8;
  float *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  plus<float> local_29 [9];
  Mat *local_20;
  Mat *local_18;
  Mat *local_10;
  
  local_30 = in_RDI->w;
  local_34 = in_RDI->h;
  local_38 = in_RDI->c;
  local_3c = local_30 * local_34;
  local_48 = in_RDI->elemsize;
  local_4c = in_RSI->w;
  local_50 = in_RSI->h;
  local_54 = in_RSI->c;
  local_58 = local_4c * local_50;
  _c = (int)(in_stack_fffffffffffff860 >> 0x20);
  _h = (int)in_stack_fffffffffffff868;
  _w = (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
  local_18 = in_RSI;
  if (in_RDI->dims == 3) {
    Mat::create(in_stack_fffffffffffff870,_w,_h,_c,
                CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                (Allocator *)in_stack_fffffffffffff850);
    bVar1 = Mat::empty(in_stack_fffffffffffff850);
    if (bVar1) {
      return -100;
    }
    if (local_18->dims == 3) {
      if ((local_18->w == 1) && (local_18->h == 1)) {
        for (local_5c = 0; local_5c < local_38; local_5c = local_5c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                       (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_a8);
          Mat::~Mat((Mat *)0x17432b);
          local_68 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                       (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_100);
          Mat::~Mat((Mat *)0x174383);
          local_c0 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                       (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_148);
          Mat::~Mat((Mat *)0x1743db);
          local_108 = pfVar2;
          for (local_14c = 0; local_14c < local_3c; local_14c = local_14c + 1) {
            fVar4 = std::plus<float>::operator()(local_29,local_68 + local_14c,local_108);
            local_c0[local_14c] = fVar4;
          }
        }
        return 0;
      }
      for (local_150 = 0; local_150 < local_38; local_150 = local_150 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_198);
        Mat::~Mat((Mat *)0x17455f);
        local_158 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_1e0);
        Mat::~Mat((Mat *)0x1745b7);
        local_1a0 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_228);
        Mat::~Mat((Mat *)0x17460f);
        local_1e8 = pfVar2;
        for (local_22c = 0; local_22c < local_3c; local_22c = local_22c + 1) {
          fVar4 = std::plus<float>::operator()(local_29,local_158 + local_22c,local_1a0 + local_22c)
          ;
          local_1e8[local_22c] = fVar4;
        }
      }
      return 0;
    }
    if (local_18->dims == 2) {
      for (local_230 = 0; local_230 < local_38; local_230 = local_230 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_278);
        Mat::~Mat((Mat *)0x1747b4);
        local_238 = pfVar2;
        local_280 = Mat::operator_cast_to_float_(local_18);
        local_280 = local_280 + local_34 * local_230;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_2c8);
        Mat::~Mat((Mat *)0x174839);
        local_288 = pfVar2;
        for (local_2cc = 0; local_2cc < local_34; local_2cc = local_2cc + 1) {
          local_2d0 = local_280[local_2cc];
          for (local_2d4 = 0; local_2d4 < local_30; local_2d4 = local_2d4 + 1) {
            fVar4 = std::plus<float>::operator()(local_29,local_238 + local_2d4,&local_2d0);
            local_288[local_2d4] = fVar4;
          }
          local_238 = local_238 + local_30;
          local_288 = local_288 + local_30;
        }
      }
      return 0;
    }
    if (local_18->dims == 1) {
      if (local_18->w == 1) {
        pfVar2 = Mat::operator[](local_18,0);
        local_2d8 = *pfVar2;
        for (local_2dc = 0; local_2dc < local_38; local_2dc = local_2dc + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                       (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_328);
          Mat::~Mat((Mat *)0x174a6c);
          local_2e8 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                       (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_370);
          Mat::~Mat((Mat *)0x174ac4);
          local_330 = pfVar2;
          for (local_374 = 0; local_374 < local_3c; local_374 = local_374 + 1) {
            fVar4 = std::plus<float>::operator()(local_29,local_2e8 + local_374,&local_2d8);
            local_330[local_374] = fVar4;
          }
        }
        return 0;
      }
      for (local_378 = 0; local_378 < local_38; local_378 = local_378 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_3c0);
        Mat::~Mat((Mat *)0x174c22);
        local_380 = pfVar2;
        pfVar2 = Mat::operator[](local_18,local_378);
        local_3c4 = *pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_410);
        Mat::~Mat((Mat *)0x174c9b);
        local_3d0 = pfVar2;
        for (local_414 = 0; local_414 < local_3c; local_414 = local_414 + 1) {
          fVar4 = std::plus<float>::operator()(local_29,local_380 + local_414,&local_3c4);
          local_3d0[local_414] = fVar4;
        }
      }
      return 0;
    }
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RDI;
    if (in_RDI->dims == 2) {
      if (in_RSI->dims == 3) {
        Mat::create(in_stack_fffffffffffff870,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                    (Allocator *)in_stack_fffffffffffff850);
        bVar1 = Mat::empty(in_stack_fffffffffffff850);
        if (!bVar1) {
          for (local_418 = 0; local_418 < local_54; local_418 = local_418 + 1) {
            local_420 = Mat::operator_cast_to_float_(local_10);
            local_420 = local_420 + local_50 * local_418;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                         (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_468);
            Mat::~Mat((Mat *)0x174ea8);
            local_428 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                         (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_4b0);
            Mat::~Mat((Mat *)0x174efa);
            local_470 = pfVar2;
            for (local_4b4 = 0; local_4b4 < local_50; local_4b4 = local_4b4 + 1) {
              local_4b8 = local_420[local_4b4];
              for (local_4bc = 0; local_4bc < local_4c; local_4bc = local_4bc + 1) {
                fVar4 = std::plus<float>::operator()(local_29,&local_4b8,local_428 + local_4bc);
                local_470[local_4bc] = fVar4;
              }
              local_428 = local_428 + local_4c;
              local_470 = local_470 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(in_stack_fffffffffffff870,_w,_h,in_stack_fffffffffffff860,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      bVar1 = Mat::empty(in_stack_fffffffffffff850);
      if (bVar1) {
        return -100;
      }
      if (local_18->dims == 2) {
        for (local_4c0 = 0; local_4c0 < local_3c; local_4c0 = local_4c0 + 1) {
          pfVar2 = Mat::operator[](local_10,local_4c0);
          pfVar3 = Mat::operator[](local_18,local_4c0);
          fVar4 = std::plus<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_4c0);
          *pfVar2 = fVar4;
        }
        return 0;
      }
      if (local_18->dims == 1) {
        Mat::create(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20),
                    (int)in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        bVar1 = Mat::empty(in_stack_fffffffffffff850);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_4c4 = *pfVar2;
          for (local_4c8 = 0; local_4c8 < local_3c; local_4c8 = local_4c8 + 1) {
            pfVar2 = Mat::operator[](local_10,local_4c8);
            fVar4 = std::plus<float>::operator()(local_29,pfVar2,&local_4c4);
            pfVar2 = Mat::operator[](local_20,local_4c8);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        local_4d0 = Mat::operator_cast_to_float_(local_10);
        local_4d8 = Mat::operator_cast_to_float_(local_20);
        for (local_4dc = 0; local_4dc < local_34; local_4dc = local_4dc + 1) {
          pfVar2 = Mat::operator[](local_18,local_4dc);
          local_4e0 = *pfVar2;
          for (local_4e4 = 0; local_4e4 < local_30; local_4e4 = local_4e4 + 1) {
            fVar4 = std::plus<float>::operator()(local_29,local_4d0 + local_4e4,&local_4e0);
            local_4d8[local_4e4] = fVar4;
          }
          local_4d0 = local_4d0 + local_30;
          local_4d8 = local_4d8 + local_30;
        }
        return 0;
      }
    }
    else if (in_RDI->dims == 1) {
      if (in_RDI->w == 1) {
        if (in_RSI->dims == 3) {
          Mat::create(in_stack_fffffffffffff870,_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (Allocator *)in_stack_fffffffffffff850);
          bVar1 = Mat::empty(in_stack_fffffffffffff850);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_4e8 = *pfVar2;
            for (local_4ec = 0; local_4ec < local_54; local_4ec = local_4ec + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                           (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_538);
              Mat::~Mat((Mat *)0x175500);
              local_4f8 = pfVar2;
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                           (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_580);
              Mat::~Mat((Mat *)0x17554c);
              local_540 = pfVar2;
              for (local_584 = 0; local_584 < local_58; local_584 = local_584 + 1) {
                fVar4 = std::plus<float>::operator()(local_29,&local_4e8,local_4f8 + local_584);
                local_540[local_584] = fVar4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 2) {
          Mat::create(in_stack_fffffffffffff870,_w,_h,in_stack_fffffffffffff860,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          bVar1 = Mat::empty(in_stack_fffffffffffff850);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_588 = *pfVar2;
            for (local_58c = 0; local_58c < local_58; local_58c = local_58c + 1) {
              pfVar2 = Mat::operator[](local_18,local_58c);
              fVar4 = std::plus<float>::operator()(local_29,&local_588,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_58c);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 1) {
          Mat::create(in_stack_fffffffffffff870,_w,in_stack_fffffffffffff860,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          bVar1 = Mat::empty(in_stack_fffffffffffff850);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_590 = *pfVar2;
            for (local_594 = 0; local_594 < local_58; local_594 = local_594 + 1) {
              pfVar2 = Mat::operator[](local_18,local_594);
              fVar4 = std::plus<float>::operator()(local_29,&local_590,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_594);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
      }
      if (in_RSI->dims == 3) {
        Mat::create(in_stack_fffffffffffff870,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                    (Allocator *)in_stack_fffffffffffff850);
        bVar1 = Mat::empty(in_stack_fffffffffffff850);
        if (!bVar1) {
          for (local_598 = 0; local_598 < local_54; local_598 = local_598 + 1) {
            pfVar2 = Mat::operator[](local_10,local_598);
            local_59c = *pfVar2;
            pMVar5 = &local_5e8;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                         (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(pMVar5);
            Mat::~Mat((Mat *)0x175941);
            pMVar5 = &local_630;
            local_5a8 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                         (int)((ulong)in_stack_fffffffffffff850 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(pMVar5);
            Mat::~Mat((Mat *)0x17598d);
            local_5f0 = pfVar2;
            for (local_634 = 0; local_634 < local_58; local_634 = local_634 + 1) {
              fVar4 = std::plus<float>::operator()(local_29,&local_59c,local_5a8 + local_634);
              local_5f0[local_634] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 2) {
        Mat::create(in_stack_fffffffffffff870,_w,_h,in_stack_fffffffffffff860,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        bVar1 = Mat::empty(in_stack_fffffffffffff850);
        if (!bVar1) {
          local_640 = Mat::operator_cast_to_float_(local_18);
          local_648 = Mat::operator_cast_to_float_(local_20);
          for (local_64c = 0; local_64c < local_50; local_64c = local_64c + 1) {
            pfVar2 = Mat::operator[](local_10,local_64c);
            local_650 = *pfVar2;
            for (local_654 = 0; local_654 < local_4c; local_654 = local_654 + 1) {
              fVar4 = std::plus<float>::operator()(local_29,&local_650,local_640 + local_654);
              local_648[local_654] = fVar4;
            }
            local_640 = local_640 + local_4c;
            local_648 = local_648 + local_4c;
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 1) {
        Mat::create(in_stack_fffffffffffff870,_w,in_stack_fffffffffffff860,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        bVar1 = Mat::empty(in_stack_fffffffffffff850);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_658 = *pfVar2;
          for (local_65c = 0; local_65c < local_3c; local_65c = local_65c + 1) {
            pfVar2 = Mat::operator[](local_10,local_65c);
            fVar4 = std::plus<float>::operator()(local_29,pfVar2,&local_658);
            pfVar2 = Mat::operator[](local_20,local_65c);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        for (local_660 = 0; local_660 < local_3c; local_660 = local_660 + 1) {
          pfVar2 = Mat::operator[](local_10,local_660);
          pfVar3 = Mat::operator[](local_18,local_660);
          fVar4 = std::plus<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_660);
          *pfVar2 = fVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;
    size_t elemsize = a.elemsize;

    int w1 = b.w;
    int h1 = b.h;
    int channels1 = b.c;
    int size1 = w1 * h1;

    if (a.dims == 3)
    {
        c.create(w, h, channels, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 3)
        {
            if (b.w == 1&&b.h==1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);
                    const float* b0 = b.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], b0[0]);
                    }
                }

                return 0;
             }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = (const float*)b + h * q;
                float* outptr = c.channel(q);

                for (int y=0; y<h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x=0; x<w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }

            return 0;
        }

        if (b.dims == 1)
        {
            if (b.w == 1)
            {
                const float b0 = b[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] = op(ptr[i], b0);
                    }
                }

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float b0 = b[q];
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], b0);
                }
            }

            return 0;
        }
    }
    else if (a.dims == 2)
    {
        if (b.dims == 3)
        {
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float* ptr = (const float*)a + h1 * q;
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h1; y++)
                {
                    const float a0 = ptr[y];
                    for (int x=0; x<w1; x++)
                    {
                        outptr[x] = op(a0, ptr1[x]);
                    }

                    ptr1 += w1;
                    outptr += w1;
                }
            }

            return 0;
        }

        c.create(w, h, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, h, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            const float* ptr = a;
            float* outptr = c;

            for (int y=0; y<h; y++)
            {
                const float b0 = b[y];
                for (int x=0; x<w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }

            return 0;
        }
    }
    else if (a.dims == 1)
    {
        if (a.w == 1)
        {
            if (b.dims == 3)
            {
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels1; q++)
                {
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size1; i++)
                    {
                        outptr[i] = op(a0, ptr1[i]);
                    }
                }

                return 0;
            }

            if (b.dims == 2)
            {
                c.create(w1, h1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }

            if (b.dims == 1)
            {
                c.create(w1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }
        }

        if (b.dims == 3)
        {
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float a0 = a[q];
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size1; i++)
                {
                    outptr[i] = op(a0, ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            c.create(w1, h1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            const float* ptr1 = b;
            float* outptr = c;

            for (int y=0; y<h1; y++)
            {
                const float a0 = a[y];
                for (int x=0; x<w1; x++)
                {
                    outptr[x] = op(a0, ptr1[x]);
                }

                ptr1 += w1;
                outptr += w1;
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }
        }
    }

    return 0;
}